

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC16_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  int iVar1;
  int iVar2;
  longlong *in_RDX;
  longlong *in_RSI;
  uint8_t *in_RDI;
  int DC;
  __m128i left_row;
  __m128i top_row;
  longlong local_48;
  longlong lStack_40;
  longlong local_38;
  longlong lStack_30;
  uint8_t *local_18;
  
  local_38 = *in_RDX;
  lStack_30 = in_RDX[1];
  local_48 = *in_RSI;
  lStack_40 = in_RSI[1];
  local_18 = in_RDI;
  iVar1 = VP8HorizontalAdd8b((__m128i *)&local_38);
  iVar2 = VP8HorizontalAdd8b((__m128i *)&local_48);
  Put16_SSE2((uint8_t)(iVar1 + iVar2 + 0x10 >> 5),local_18);
  return;
}

Assistant:

static void DC16_SSE2(uint8_t* dst) {  // DC
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadu_si128((const __m128i*)(dst - BPS));
  const __m128i sad8x2 = _mm_sad_epu8(top, zero);
  // sum the two sads: sad8x2[0:1] + sad8x2[8:9]
  const __m128i sum = _mm_add_epi16(sad8x2, _mm_shuffle_epi32(sad8x2, 2));
  int left = 0;
  int j;
  for (j = 0; j < 16; ++j) {
    left += dst[-1 + j * BPS];
  }
  {
    const int DC = _mm_cvtsi128_si32(sum) + left + 16;
    Put16_SSE2(DC >> 5, dst);
  }
}